

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.h
# Opt level: O2

ValueInfo * __thiscall
ValueInfo::CopyWithGenericStructureKind(ValueInfo *this,JitArenaAllocator *allocator)

{
  ValueInfo *this_00;
  
  this_00 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x18,allocator,0x3d6ef4);
  ValueInfo(this_00,this,false);
  return this_00;
}

Assistant:

ValueInfo *             CopyWithGenericStructureKind(JitArenaAllocator * allocator) const
    {
        return JitAnew(allocator, ValueInfo, *this, false);
    }